

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR get_argument(lysp_yang_ctx *ctx,yang_arg arg,uint16_t *flags,char **word_p,char **word_b,
                   size_t *word_len)

{
  char cVar1;
  bool bVar2;
  uint8_t comment_00;
  void *pvVar3;
  ushort uVar4;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_68;
  uint8_t local_51;
  int comment;
  ly_bool str_end;
  uint8_t prefix;
  size_t buf_len;
  size_t *psStack_40;
  LY_ERR ret;
  size_t *word_len_local;
  char **word_b_local;
  char **word_p_local;
  uint16_t *flags_local;
  lysp_yang_ctx *plStack_18;
  yang_arg arg_local;
  lysp_yang_ctx *ctx_local;
  
  _comment = 0;
  local_51 = '\0';
  bVar2 = false;
  *word_b = (char *)0x0;
  *word_p = (char *)0x0;
  *word_len = 0;
  psStack_40 = word_len;
  word_len_local = (size_t *)word_b;
  word_b_local = word_p;
  word_p_local = (char **)flags;
  flags_local._4_4_ = arg;
  plStack_18 = ctx;
LAB_001ba053:
  while( true ) {
    while( true ) {
      if (bVar2) {
        if (*word_len_local != 0) {
          pvVar3 = ly_realloc((void *)*word_len_local,*psStack_40 + 1);
          *word_len_local = (size_t)pvVar3;
          if (*word_len_local == 0) {
            if (plStack_18 == (lysp_yang_ctx *)0x0) {
              local_98 = (ly_ctx *)0x0;
            }
            else {
              local_98 = (ly_ctx *)
                         **(undefined8 **)
                           (plStack_18->parsed_mods->field_2).dnodes
                           [plStack_18->parsed_mods->count - 1];
            }
            ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","get_argument");
            return LY_EMEM;
          }
          *(undefined1 *)(*word_len_local + *psStack_40) = 0;
          *word_b_local = (char *)*word_len_local;
        }
        return LY_SUCCESS;
      }
      cVar1 = *plStack_18->in->current;
      if (cVar1 == '\0') {
        if (plStack_18 == (lysp_yang_ctx *)0x0) {
          local_90 = (ly_ctx *)0x0;
        }
        else {
          local_90 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
        buf_len._4_4_ = LY_EVALID;
        goto LAB_001ba75c;
      }
      if (cVar1 != '\t') break;
      if (*psStack_40 == 0) {
        plStack_18->indent = plStack_18->indent + 8;
        plStack_18->in->current = plStack_18->in->current + 1;
      }
      else {
        bVar2 = true;
      }
    }
    if (cVar1 != '\n') break;
LAB_001ba473:
    if (*psStack_40 == 0) {
      plStack_18->in->line = plStack_18->in->line + 1;
      ly_in_skip(plStack_18->in,1);
      plStack_18->indent = plStack_18->indent + 1;
      plStack_18->indent = 0;
    }
    else {
      bVar2 = true;
    }
  }
  if (cVar1 == '\r') {
    if (plStack_18->in->current[1] == '\n') {
      ly_in_skip(plStack_18->in,1);
      plStack_18->indent = plStack_18->indent + 1;
      goto LAB_001ba473;
    }
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
            (ulong)(uint)(int)*plStack_18->in->current);
    buf_len._4_4_ = LY_EVALID;
  }
  else {
    if (cVar1 == ' ') {
      if (*psStack_40 == 0) {
        ly_in_skip(plStack_18->in,1);
        plStack_18->indent = plStack_18->indent + 1;
      }
      else {
        bVar2 = true;
      }
      goto LAB_001ba053;
    }
    if ((cVar1 == '\"') || (cVar1 == '\'')) {
      if (*psStack_40 == 0) {
        if (word_p_local != (char **)0x0) {
          uVar4 = 0x200;
          if (*plStack_18->in->current == '\'') {
            uVar4 = 0x100;
          }
          *(ushort *)word_p_local = *(ushort *)word_p_local | uVar4;
        }
        buf_len._4_4_ =
             read_qstring(plStack_18,flags_local._4_4_,word_b_local,(char **)word_len_local,
                          psStack_40,(size_t *)&comment);
        if (buf_len._4_4_ == LY_SUCCESS) {
          if (*word_b_local == (char *)0x0) {
            *word_b_local = "";
          }
          bVar2 = true;
          buf_len._4_4_ = 0;
          goto LAB_001ba053;
        }
      }
      else {
        if (plStack_18 == (lysp_yang_ctx *)0x0) {
          local_68 = (ly_ctx *)0x0;
        }
        else {
          local_68 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s."
                ,1,plStack_18->in->current,
                "unquoted string character, optsep, semicolon or opening brace");
        buf_len._4_4_ = LY_EVALID;
      }
    }
    else if (cVar1 == '/') {
      comment_00 = '\0';
      if (plStack_18->in->current[1] == '/') {
        comment_00 = '\x01';
      }
      else if (plStack_18->in->current[1] == '*') {
        comment_00 = '\x02';
      }
      else {
        buf_len._4_4_ =
             buf_store_char(plStack_18,flags_local._4_4_,word_b_local,psStack_40,
                            (char **)word_len_local,(size_t *)&comment,'\0',&local_51);
        if (buf_len._4_4_ != LY_SUCCESS) goto LAB_001ba75c;
        buf_len._4_4_ = 0;
      }
      if (comment_00 == '\0') goto LAB_001ba053;
      if (*psStack_40 == 0) {
        ly_in_skip(plStack_18->in,2);
        plStack_18->indent = plStack_18->indent + 2;
        buf_len._4_4_ = skip_comment(plStack_18,comment_00);
        if (buf_len._4_4_ == LY_SUCCESS) {
          buf_len._4_4_ = 0;
          goto LAB_001ba053;
        }
      }
      else {
        if (plStack_18 == (lysp_yang_ctx *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX,
                "Invalid comment sequence \"%.2s\" in an unquoted string.",plStack_18->in->current);
        buf_len._4_4_ = LY_EVALID;
      }
    }
    else if ((cVar1 == ';') || (cVar1 == '{')) {
      if ((*psStack_40 != 0) || (flags_local._4_4_ == Y_MAYBE_STR_ARG)) {
        bVar2 = true;
        goto LAB_001ba053;
      }
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",1
              ,plStack_18->in->current,"an argument");
      buf_len._4_4_ = LY_EVALID;
    }
    else {
      if (cVar1 != '}') {
        buf_len._4_4_ =
             buf_store_char(plStack_18,flags_local._4_4_,word_b_local,psStack_40,
                            (char **)word_len_local,(size_t *)&comment,'\0',&local_51);
        if (buf_len._4_4_ != LY_SUCCESS) goto LAB_001ba75c;
        buf_len._4_4_ = 0;
        goto LAB_001ba053;
      }
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",1
              ,plStack_18->in->current,
              "unquoted string character, optsep, semicolon or opening brace");
      buf_len._4_4_ = LY_EVALID;
    }
  }
LAB_001ba75c:
  free((void *)*word_len_local);
  *word_len_local = 0;
  return buf_len._4_4_;
}

Assistant:

LY_ERR
get_argument(struct lysp_yang_ctx *ctx, enum yang_arg arg, uint16_t *flags, char **word_p,
        char **word_b, size_t *word_len)
{
    LY_ERR ret;
    size_t buf_len = 0;
    uint8_t prefix = 0;
    ly_bool str_end = 0;
    int comment;

    /* word buffer - dynamically allocated */
    *word_b = NULL;

    /* word pointer - just a pointer to data */
    *word_p = NULL;

    *word_len = 0;
    while (!str_end) {
        switch (ctx->in->current[0]) {
        case '\'':
        case '\"':
            if (*word_len) {
                /* invalid - quotes cannot be in unquoted string and only optsep, ; or { can follow it */
                LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                        "unquoted string character, optsep, semicolon or opening brace");
                ret = LY_EVALID;
                goto error;
            }
            if (flags) {
                (*flags) |= (ctx->in->current[0] == '\'') ? LYS_SINGLEQUOTED : LYS_DOUBLEQUOTED;
            }

            LY_CHECK_GOTO(ret = read_qstring(ctx, arg, word_p, word_b, word_len, &buf_len), error);
            if (!*word_p) {
                /* do not return NULL word */
                *word_p = "";
            }
            str_end = 1;
            break;
        case '/':
            comment = 0;
            if (ctx->in->current[1] == '/') {
                /* one-line comment */
                comment = 1;
            } else if (ctx->in->current[1] == '*') {
                /* block comment */
                comment = 2;
            } else {
                /* not a comment after all */
                LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            }

            if (comment) {
                if (*word_len) {
                    /* invalid comment sequence (RFC 7950 sec. 6.1.3.) */
                    LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Invalid comment sequence \"%.2s\" in an unquoted string.", ctx->in->current);
                    ret = LY_EVALID;
                    goto error;
                }

                /* skip the comment */
                MOVE_INPUT(ctx, 2);
                LY_CHECK_GOTO(ret = skip_comment(ctx, comment), error);
            }
            break;
        case ' ':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            MOVE_INPUT(ctx, 1);
            break;
        case '\t':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            /* tabs count for 8 spaces */
            ctx->indent += Y_TAB_SPACES;

            ++ctx->in->current;
            break;
        case '\r':
            if (ctx->in->current[1] != '\n') {
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[0]);
                ret = LY_EVALID;
                goto error;
            }
            MOVE_INPUT(ctx, 1);
        /* fallthrough */
        case '\n':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            LY_IN_NEW_LINE(ctx->in);
            MOVE_INPUT(ctx, 1);

            /* reset indent */
            ctx->indent = 0;
            break;
        case ';':
        case '{':
            if (*word_len || (arg == Y_MAYBE_STR_ARG)) {
                /* word is finished */
                str_end = 1;
                break;
            }

            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current, "an argument");
            ret = LY_EVALID;
            goto error;
        case '}':
            /* invalid - braces cannot be in unquoted string (opening braces terminates the string and can follow it) */
            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                    "unquoted string character, optsep, semicolon or opening brace");
            ret = LY_EVALID;
            goto error;
        case '\0':
            /* unexpected EOF */
            LOGVAL_PARSER(ctx, LY_VCODE_EOF);
            ret = LY_EVALID;
            goto error;
        default:
            LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            break;
        }
    }

    /* terminating NULL byte for buf */
    if (*word_b) {
        (*word_b) = ly_realloc(*word_b, (*word_len) + 1);
        LY_CHECK_ERR_RET(!(*word_b), LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
        (*word_b)[*word_len] = '\0';
        *word_p = *word_b;
    }

    return LY_SUCCESS;

error:
    free(*word_b);
    *word_b = NULL;
    return ret;
}